

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyHashingShardedKVS.hpp
# Opt level: O0

void __thiscall
supermap::
KeyHashingShardedKVS<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long>
::add(KeyHashingShardedKVS<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long>
      *this,Key<30UL> *key,MaybeRemovedValue<supermap::ByteArray<100UL>_> *value)

{
  size_t __n;
  pointer pKVar1;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  Key<30UL> *in_stack_00000028;
  KeyHashingShardedKVS<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long>
  *in_stack_00000030;
  
  __n = getShardIdForKey(in_stack_00000030,in_stack_00000028);
  std::
  vector<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long>_>_>,_std::allocator<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long>_>_>_>_>
  ::operator[]((vector<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long>_>_>,_std::allocator<std::unique_ptr<supermap::KeyValueStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long>_>_>_>_>
                *)(in_RDI + 8),__n);
  pKVar1 = std::
           unique_ptr<supermap::KeyValueStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long>_>_>
           ::operator->((unique_ptr<supermap::KeyValueStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long>,_std::default_delete<supermap::KeyValueStorage<supermap::Key<30UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<100UL>_>,_unsigned_long>_>_>
                         *)0x138c23);
  (**pKVar1->_vptr_KeyValueStorage)(pKVar1,in_RSI,in_RDX);
  return;
}

Assistant:

void add(const Key &key, Value &&value) override {
        nestedStorages_[getShardIdForKey(key)]->add(key, std::move(value));
    }